

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testValidDeConvolution3D(void)

{
  RepeatedField<long> *this;
  RepeatedField<float> *pRVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  GRULayerParams *pGVar6;
  bool bVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  long *plVar10;
  FeatureDescription *pFVar11;
  NeuralNetworkLayer *pNVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  void *pvVar14;
  Convolution3DLayerParams *pCVar15;
  WeightParams *pWVar16;
  float *pfVar17;
  ostream *poVar18;
  undefined8 *puVar19;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar20;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  uint32_t size;
  uint uVar21;
  int iVar22;
  Arena *pAVar23;
  Model m1;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar4 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00197899:
    pRVar20 = &(MStack_78.description_)->input_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar22 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_00197899;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar14 = pRVar4->elements[iVar22];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"input",puVar19);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar23);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  this = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar2] = 1;
  uVar21 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar21;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar21 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar21] = 3;
  uVar21 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar21;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar21 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar21] = 0x20;
  uVar21 = uVar2 + 3;
  (pAVar9->shape_).current_size_ = uVar21;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar21 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar21] = 100;
  uVar21 = uVar2 + 4;
  (pAVar9->shape_).current_size_ = uVar21;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar21 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(this);
  plVar10[uVar21] = 100;
  this->current_size_ = uVar2 + 5;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar4 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00197a5d:
    pRVar20 = &(MStack_78.description_)->output_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar22 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_00197a5d;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar14 = pRVar4->elements[iVar22];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"probs",puVar19);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar23);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar23 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar23);
  }
  (MStack_78.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00197b54:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar12);
  }
  else {
    iVar22 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_00197b54;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar22 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar4->elements[iVar22];
  }
  pRVar4 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00197b8c:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar22 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_00197b8c;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar14 = pRVar4->elements[iVar22];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3cb973);
  pRVar4 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar22 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar22 < pRVar4->allocated_size) {
      (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
      pvVar14 = pRVar4->elements[iVar22];
      goto LAB_00197bf6;
    }
  }
  pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar13);
LAB_00197bf6:
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3b872d);
  if (pNVar12->_oneof_case_[0] != 0x5bf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x5bf;
    uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pCVar15 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::Convolution3DLayerParams>(pAVar23);
    (pNVar12->layer_).convolution3d_ = pCVar15;
  }
  pGVar6 = (pNVar12->layer_).gru_;
  *(undefined8 *)((long)&pGVar6->outputgateweightmatrix_ + 4) = 0x100000003;
  *(undefined4 *)&pGVar6->outputgateweightmatrix_ = 3;
  *(undefined8 *)((long)&pGVar6->updategaterecursionmatrix_ + 4) = 0x300000003;
  *(undefined4 *)((long)&pGVar6->resetgaterecursionmatrix_ + 4) = 3;
  pGVar6->outputgaterecursionmatrix_ = (WeightParams *)0x100000001;
  pGVar6->updategatebiasvector_ = (WeightParams *)0x100000001;
  pGVar6->resetgatebiasvector_ = (WeightParams *)0x100000001;
  *(undefined8 *)((long)&pGVar6->outputgatebiasvector_ + 4) = 0;
  *(undefined8 *)((long)&pGVar6->inputvectorsize_ + 4) = 0;
  pGVar6->outputvectorsize_ = 0;
  pGVar6->sequenceoutput_ = false;
  pGVar6->hasbiasvectors_ = false;
  pGVar6->reverseinput_ = false;
  pGVar6->field_0x83 = 0;
  pGVar6->_cached_size_ = (atomic<int>)0x0;
  *(undefined2 *)&pGVar6->outputgatebiasvector_ = 0x101;
  iVar22 = 0xf3;
  do {
    if (pGVar6->updategateweightmatrix_ == (WeightParams *)0x0) {
      uVar5 = (pGVar6->super_MessageLite)._internal_metadata_.ptr_;
      pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar23 = *(Arena **)pAVar23;
      }
      pWVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar23);
      pGVar6->updategateweightmatrix_ = pWVar16;
    }
    pWVar16 = pGVar6->updategateweightmatrix_;
    pRVar1 = &pWVar16->floatvalue_;
    uVar2 = (pWVar16->floatvalue_).current_size_;
    uVar3 = (pWVar16->floatvalue_).total_size_;
    if (uVar2 == uVar3) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar3 + 1);
    }
    pfVar17 = google::protobuf::RepeatedField<float>::elements(pRVar1);
    pfVar17[uVar2] = 1.0;
    pRVar1->current_size_ = uVar2 + 1;
    iVar22 = iVar22 + -1;
  } while (iVar22 != 0);
  iVar22 = 3;
  do {
    if (pGVar6->resetgateweightmatrix_ == (WeightParams *)0x0) {
      uVar5 = (pGVar6->super_MessageLite)._internal_metadata_.ptr_;
      pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar23 = *(Arena **)pAVar23;
      }
      pWVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar23);
      pGVar6->resetgateweightmatrix_ = pWVar16;
    }
    pWVar16 = pGVar6->resetgateweightmatrix_;
    pRVar1 = &pWVar16->floatvalue_;
    uVar2 = (pWVar16->floatvalue_).current_size_;
    uVar3 = (pWVar16->floatvalue_).total_size_;
    if (uVar2 == uVar3) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar3 + 1);
    }
    pfVar17 = google::protobuf::RepeatedField<float>::elements(pRVar1);
    pfVar17[uVar2] = 1.0;
    pRVar1->current_size_ = uVar2 + 1;
    iVar22 = iVar22 + -1;
  } while (iVar22 != 0);
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar7 = CoreML::Result::good(&local_48);
  if (!bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xa96);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)!bVar7;
}

Assistant:

int testValidDeConvolution3D() {
    Specification::Model m1;

    int input_channels = 3;
    int output_channels = 3;
    int kernel_depth = 3;
    int kernel_height = 3;
    int kernel_width = 3;
    int nGroups = 1;
    int stride_depth = 1;
    int stride_height = 1;
    int stride_width = 1;
    int dilation_depth = 1;
    int dilation_height = 1;
    int dilation_width = 1;
    int pad_front = 0;
    int pad_back = 0;
    int pad_top = 0;
    int pad_bottom = 0;
    int pad_left = 0;
    int pad_right = 0;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(3);
    shape->add_shape(32);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution3d();
    params->set_inputchannels(input_channels);
    params->set_outputchannels(output_channels);
    params->set_kerneldepth(kernel_depth);
    params->set_kernelheight(kernel_height);
    params->set_kernelwidth(kernel_width);
    params->set_ngroups(nGroups);
    params->set_stridedepth(stride_depth);
    params->set_strideheight(stride_height);
    params->set_stridewidth(stride_width);
    params->set_dilationdepth(dilation_depth);
    params->set_dilationheight(dilation_height);
    params->set_dilationwidth(dilation_width);
    params->set_paddingtype(CoreML::Specification::Convolution3DLayerParams_PaddingType_CUSTOM);
    params->set_custompaddingfront(pad_front);
    params->set_custompaddingback(pad_back);
    params->set_custompaddingtop(pad_top);
    params->set_custompaddingbottom(pad_bottom);
    params->set_custompaddingleft(pad_left);
    params->set_custompaddingright(pad_right);
    params->set_isdeconvolution(true);
    params->set_hasbias(true);

    // Fill weights
    for (int i = 0; i < output_channels * (input_channels / nGroups) * kernel_depth * kernel_height * kernel_width; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Fill bias
    for (int i = 0; i < output_channels; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}